

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::InsertHeavyRows(Codec *this)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  ushort uVar4;
  undefined2 uVar5;
  uint uVar6;
  uint uVar7;
  uint16_t *puVar8;
  uint8_t *puVar9;
  uint64_t *puVar10;
  bool bVar11;
  int iVar12;
  short sVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ushort uVar18;
  ulong uVar19;
  uint uVar20;
  
  uVar17 = this->_pivot_count;
  uVar1 = this->_defer_count;
  uVar2 = this->_dense_count;
  uVar20 = uVar17;
  if (0 < (long)(int)uVar17) {
    uVar3 = this->_mix_count;
    uVar18 = uVar2 + uVar1;
    uVar19 = (ulong)uVar17;
    uVar14 = (long)(int)uVar17;
    do {
      puVar8 = this->_pivots;
      uVar15 = uVar14 - 1;
      uVar4 = puVar8[uVar14 - 1];
      if (uVar18 <= uVar4) {
        if (this->_next_pivot <= uVar15) {
          uVar19 = (ulong)((int)uVar19 - 1);
          puVar8[uVar15] = puVar8[uVar19];
          puVar8[uVar19] = uVar4;
        }
        uVar17 = this->_first_heavy_column;
        uVar20 = (uint)(ushort)(uVar3 + uVar1);
        if (uVar17 < uVar20) {
          uVar6 = this->_ge_pitch;
          uVar7 = this->_heavy_pitch;
          puVar9 = this->_heavy_matrix;
          puVar10 = this->_ge_matrix;
          do {
            puVar9[(ulong)(uVar17 - this->_first_heavy_column) +
                   (ulong)(((uint)uVar4 - (uint)uVar18) * uVar7)] =
                 (puVar10[(ulong)(uVar4 * uVar6) + (ulong)(uVar17 >> 6)] >> ((ulong)uVar17 & 0x3f) &
                 1) != 0;
            uVar17 = uVar17 + 1;
          } while (uVar20 != uVar17);
        }
      }
      uVar17 = (uint)uVar19;
      bVar11 = 1 < (long)uVar14;
      uVar14 = uVar15;
    } while (bVar11);
    uVar20 = this->_pivot_count;
  }
  this->_first_heavy_pivot = uVar17;
  lVar16 = 0;
  puVar8 = this->_pivots;
  do {
    sVar13 = (short)lVar16;
    uVar5 = this->_extra_count;
    iVar12 = (int)lVar16;
    lVar16 = lVar16 + 1;
    puVar8[uVar20 + iVar12] = uVar1 + uVar2 + sVar13 + uVar5;
  } while (lVar16 != 6);
  this->_pivot_count = uVar20 + 6;
  return;
}

Assistant:

void Codec::InsertHeavyRows()
{
    CAT_IF_DUMP(cout << endl << "---- InsertHeavyRows ----" << endl << endl;)

    CAT_IF_DUMP(cout << "Converting remaining extra rows to heavy...";)

    // Initialize index of first heavy pivot
    unsigned first_heavy_pivot = _pivot_count;

    const uint16_t column_count = _defer_count + _mix_count;
    const uint16_t first_heavy_row = _defer_count + _dense_count;

    // For each remaining pivot in the list:
    for (int pivot_j = (int)_pivot_count - 1; pivot_j >= 0; --pivot_j)
    {
        CAT_DEBUG_ASSERT((unsigned)pivot_j < _pivot_count);
        const uint16_t ge_row_j = _pivots[pivot_j];

        // If row is extra:
        if (ge_row_j < first_heavy_row) {
            continue;
        }

        // If pivot is still unused:
        if ((unsigned)pivot_j >= _next_pivot)
        {
            CAT_DEBUG_ASSERT(first_heavy_pivot > 0);
            --first_heavy_pivot;

            // Swap pivot j into last heavy pivot position
            CAT_DEBUG_ASSERT(first_heavy_pivot < _pivot_count);
            _pivots[pivot_j] = _pivots[first_heavy_pivot];
            _pivots[first_heavy_pivot] = ge_row_j;
        }

        CAT_IF_DUMP(cout << " row=" << ge_row_j << ", pivot=" << pivot_j;)

        CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
        uint8_t * GF256_RESTRICT extra_row = _heavy_matrix + _heavy_pitch * (ge_row_j - first_heavy_row);
        const uint64_t * GF256_RESTRICT ge_extra_row = _ge_matrix + _ge_pitch * ge_row_j;

        // Copy heavy columns to heavy matrix row

        for (unsigned ge_column_j = _first_heavy_column; ge_column_j < column_count; ++ge_column_j)
        {
            // Find bit for this column
            const uint64_t column_bit = (ge_extra_row[ge_column_j >> 6] >> (ge_column_j & 63)) & 1;

            // Set extra row byte to 0 or 1
            CAT_DEBUG_ASSERT(ge_column_j >= _first_heavy_column);
            extra_row[ge_column_j - _first_heavy_column] = static_cast<uint8_t>(column_bit);
        }
    }

    CAT_IF_DUMP(cout << endl;)

    // Store first heavy pivot index
    _first_heavy_pivot = first_heavy_pivot;

    // Add heavy rows at the end to cause them to be selected last if given a choice
    for (uint16_t heavy_i = 0; heavy_i < kHeavyRows; ++heavy_i) {
        // Use GE row index after extra count even if not all are used yet
        _pivots[_pivot_count + heavy_i] = first_heavy_row + _extra_count + heavy_i;
    }

    _pivot_count += kHeavyRows;

    CAT_IF_DUMP(cout << "Added heavy rows to the end of the pivots list." << endl;)
}